

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
goodform::array_validator::for_each
          (array_validator *this,function<void_(goodform::sub_form_&,_unsigned_long)> *fn)

{
  pointer paVar1;
  size_t i;
  ulong __args_1;
  long lVar2;
  sub_form tmp;
  sub_form local_38;
  
  lVar2 = 0;
  for (__args_1 = 0;
      paVar1 = (this->value_->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
               super__Vector_impl_data._M_start,
      __args_1 <
      (ulong)((long)(this->value_->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar1 >> 4); __args_1 = __args_1 + 1)
  {
    local_38.variant_ = (any *)((long)&paVar1->_M_manager + lVar2);
    local_38.error_ = this->error_;
    std::function<void_(goodform::sub_form_&,_unsigned_long)>::operator()(fn,&local_38,__args_1);
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void array_validator::for_each(const std::function<void(sub_form& element, size_t index)>& fn)
  {
    for (size_t i = 0; i < this->value_.size(); ++i)
    {
      sub_form tmp(this->value_[i], this->error_);
      fn(tmp, i);
    }
  }